

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleIIgs.cpp
# Opt level: O0

void __thiscall Apple::IIgs::ConcreteMachine::~ConcreteMachine(ConcreteMachine *this)

{
  DoubleDensityDrive *local_38;
  DiskIIDrive *local_20;
  ConcreteMachine *this_local;
  
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_set_activity_observer_00c9b650;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00c9b6e0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00c9b700;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00c9b718;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00c9b730;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00c9b760;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00c9b7a0;
  (this->super_MouseMachine)._vptr_MouseMachine = (_func_int **)&DAT_00c9b7b8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00c9b7d0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00c9b808;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&this->audio_queue_);
  II::JoystickPair::~JoystickPair(&this->joysticks_);
  Outputs::Speaker::
  PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>::
  ~PullLowpass(&this->speaker_);
  Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>::~CompoundSource
            (&this->mixer_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::~AsyncTaskQueue(&this->audio_queue_);
  local_20 = (DiskIIDrive *)&this->audio_queue_;
  do {
    local_20 = local_20 + -1;
    Disk::DiskIIDrive::~DiskIIDrive(local_20);
  } while (local_20 != (DiskIIDrive *)&this->field_0x146d0);
  local_38 = (DoubleDensityDrive *)&this->field_0x146d0;
  do {
    local_38 = local_38 + -1;
    Macintosh::DoubleDensityDrive::~DoubleDensityDrive(local_38);
  } while (local_38 != (DoubleDensityDrive *)&this->field_0x143e0);
  JustInTimeActor<Apple::IIgs::ADB::GLU,_Cycles,_1,_4>::~JustInTimeActor(&this->adb_glu_);
  JustInTimeActor<Apple::IIgs::Video::Video,_Cycles,_1,_2>::~JustInTimeActor(&this->video_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->rom_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->ram_);
  CPU::WDC65816::Processor<Apple::IIgs::ConcreteMachine,_false>::~Processor(&this->m65816_);
  MachineTypes::MappedKeyboardMachine::~MappedKeyboardMachine(&this->super_MappedKeyboardMachine);
  IIgs::Machine::~Machine(&this->super_Machine);
  return;
}

Assistant:

~ConcreteMachine() {
			audio_queue_.flush();
		}